

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

Pos getSpawn(Generator *g)

{
  int iVar1;
  int iVar2;
  int *in_RDI;
  int tmp_1;
  int z;
  int x;
  int id_1;
  float y_2;
  int tmp;
  int grass_1;
  int ids [16];
  float y_1 [16];
  int grass;
  int id;
  float y;
  SurfaceNoise sn;
  uint32_t jj;
  uint32_t ii;
  int cz0;
  int cx0;
  int v;
  int u;
  int k;
  int j;
  int i;
  uint64_t rng;
  Pos spawn;
  undefined4 in_stack_ffffffffffffb380;
  undefined4 in_stack_ffffffffffffb384;
  int in_stack_ffffffffffffb38c;
  undefined4 in_stack_ffffffffffffb390;
  int in_stack_ffffffffffffb394;
  int in_stack_ffffffffffffb398;
  undefined4 in_stack_ffffffffffffb39c;
  int local_4c58;
  float local_4c54;
  undefined4 in_stack_ffffffffffffb3b0;
  int in_stack_ffffffffffffb3b4;
  Generator *in_stack_ffffffffffffb3b8;
  float local_4c08 [19];
  int local_4bbc;
  int local_4bb8;
  float local_4bb4;
  uint local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int *local_10;
  Pos local_8;
  
  local_10 = in_RDI;
  local_8 = estimateSpawn(in_stack_ffffffffffffb3b8,
                          (uint64_t *)CONCAT44(in_stack_ffffffffffffb3b4,in_stack_ffffffffffffb3b0))
  ;
  if (1 < *local_10) {
    initSurfaceNoise((SurfaceNoise *)CONCAT44(in_stack_ffffffffffffb394,in_stack_ffffffffffffb390),
                     in_stack_ffffffffffffb38c,
                     CONCAT44(in_stack_ffffffffffffb384,in_stack_ffffffffffffb380));
    if (*local_10 < 0x10) {
      for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
        local_4bbc = 0;
        mapApproxHeight((float *)sn.oct[5].d._224_8_,(int *)sn.oct[5].d._216_8_,
                        (Generator *)sn.oct[5].d._208_8_,(SurfaceNoise *)sn.oct[5].d._200_8_,
                        sn.oct[5].d._196_4_,sn.oct[5].d._192_4_,sn.oct[5].d._248_4_,
                        sn.oct[5]._256_4_);
        getBiomeDepthAndScale(local_4bb8,(double *)0x0,(double *)0x0,&local_4bbc);
        if ((0 < local_4bbc) && ((float)local_4bbc <= local_4bb4)) {
          return local_8;
        }
        in_stack_ffffffffffffb394 =
             nextInt((uint64_t *)CONCAT44(in_stack_ffffffffffffb39c,in_stack_ffffffffffffb398),
                     in_stack_ffffffffffffb394);
        iVar1 = nextInt((uint64_t *)CONCAT44(in_stack_ffffffffffffb39c,in_stack_ffffffffffffb398),
                        in_stack_ffffffffffffb394);
        local_8.x = (in_stack_ffffffffffffb394 - iVar1) + local_8.x;
        in_stack_ffffffffffffb398 =
             nextInt((uint64_t *)CONCAT44(in_stack_ffffffffffffb39c,in_stack_ffffffffffffb398),
                     in_stack_ffffffffffffb394);
        iVar1 = nextInt((uint64_t *)CONCAT44(in_stack_ffffffffffffb39c,in_stack_ffffffffffffb398),
                        in_stack_ffffffffffffb394);
        local_8.z = (in_stack_ffffffffffffb398 - iVar1) + local_8.z;
      }
    }
    else if (*local_10 < 0x16) {
      local_28 = 0;
      local_24 = 0;
      local_20 = 0;
      local_2c = -1;
      local_1c = 0;
      while( true ) {
        if (0x3ff < local_1c) break;
        if ((((-0x10 < local_20) && (local_20 < 0x11)) && (-0x10 < local_24)) && (local_24 < 0x11))
        {
          local_30 = (local_8.x & 0xfffffff0U) + local_20 * 0x10;
          local_34 = (local_8.z & 0xfffffff0U) + local_24 * 0x10;
          mapApproxHeight((float *)sn.oct[5].d._224_8_,(int *)sn.oct[5].d._216_8_,
                          (Generator *)sn.oct[5].d._208_8_,(SurfaceNoise *)sn.oct[5].d._200_8_,
                          sn.oct[5].d._196_4_,sn.oct[5].d._192_4_,sn.oct[5].d._248_4_,
                          sn.oct[5]._256_4_);
          for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
            for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
              iVar1 = 0;
              getBiomeDepthAndScale
                        (*(int *)(&stack0xffffffffffffb3b8 + (ulong)(local_3c * 4 + local_38) * 4),
                         (double *)0x0,(double *)0x0,(int *)&stack0xffffffffffffb3b4);
              if ((0 < iVar1) && ((float)iVar1 <= local_4c08[local_3c * 4 + local_38])) {
                local_8.z = local_34 + local_3c * 4;
                local_8.x = local_30 + local_38 * 4;
                return local_8;
              }
            }
          }
        }
        if (((local_20 == local_24) || ((local_20 < 0 && (local_20 == -local_24)))) ||
           ((0 < local_20 && (local_20 == 1 - local_24)))) {
          iVar1 = -local_2c;
          local_2c = local_28;
          local_28 = iVar1;
        }
        local_20 = local_28 + local_20;
        local_24 = local_2c + local_24;
        local_1c = local_1c + 1;
      }
      local_8.z = (local_8.z & 0xfffffff0U) + 8;
      local_8.x = (local_8.x & 0xfffffff0U) + 8;
    }
    else {
      local_28 = 0;
      local_24 = 0;
      local_20 = 0;
      local_2c = -1;
      local_1c = 0;
      while( true ) {
        if (0x78 < local_1c) break;
        if ((((-6 < local_20) && (local_20 < 6)) && (-6 < local_24)) && (local_24 < 6)) {
          local_30 = (local_8.x & 0xfffffff0U) + local_20 * 0x10;
          local_34 = (local_8.z & 0xfffffff0U) + local_24 * 0x10;
          for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
            for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
              iVar1 = local_30 + local_38 * 4;
              iVar2 = local_34 + local_3c * 4;
              mapApproxHeight((float *)sn.oct[5].d._224_8_,(int *)sn.oct[5].d._216_8_,
                              (Generator *)sn.oct[5].d._208_8_,(SurfaceNoise *)sn.oct[5].d._200_8_,
                              sn.oct[5].d._196_4_,sn.oct[5].d._192_4_,sn.oct[5].d._248_4_,
                              sn.oct[5]._256_4_);
              if (((63.0 < local_4c54) || (local_4c58 == 10)) ||
                 ((local_4c58 == 0x32 || (local_4c58 == 0xb)))) {
                local_8.z = iVar2;
                local_8.x = iVar1;
                return local_8;
              }
            }
          }
        }
        if (((local_20 == local_24) || ((local_20 < 0 && (local_20 == -local_24)))) ||
           ((0 < local_20 && (local_20 == 1 - local_24)))) {
          iVar1 = -local_2c;
          local_2c = local_28;
          local_28 = iVar1;
        }
        local_20 = local_28 + local_20;
        local_24 = local_2c + local_24;
        local_1c = local_1c + 1;
      }
      local_8.z = (local_8.z & 0xfffffff0U) + 8;
      local_8.x = (local_8.x & 0xfffffff0U) + 8;
    }
  }
  return local_8;
}

Assistant:

Pos getSpawn(const Generator *g)
{
    uint64_t rng;
    Pos spawn = estimateSpawn(g, &rng);
    int i, j, k, u, v, cx0, cz0;
    uint32_t ii, jj;

    if (g->mc <= MC_B1_7)
        return spawn;

    SurfaceNoise sn;
    initSurfaceNoise(&sn, DIM_OVERWORLD, g->seed);

    if (g->mc <= MC_1_12)
    {
        for (i = 0; i < 1000; i++)
        {
            float y;
            int id, grass = 0;
            mapApproxHeight(&y, &id, g, &sn, spawn.x >> 2, spawn.z >> 2, 1, 1);
            getBiomeDepthAndScale(id, 0, 0, &grass);
            if (grass > 0 && y >= grass)
                break;
            spawn.x += nextInt(&rng, 64) - nextInt(&rng, 64);
            spawn.z += nextInt(&rng, 64) - nextInt(&rng, 64);
        }
    }
    else if (g->mc <= MC_1_17)
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 1024; i++)
        {
            if (j > -16 && j <= 16 && k > -16 && k <= 16)
            {
                // find server spawn point in chunk
                float y[16];
                int ids[16];
                cx0 = (spawn.x & ~15) + j * 16; // start of chunk
                cz0 = (spawn.z & ~15) + k * 16;
                mapApproxHeight(y, ids, g, &sn, cx0 >> 2, cz0 >> 2, 4, 4);
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        int grass = 0;
                        getBiomeDepthAndScale(ids[jj*4+ii], 0, 0, &grass);
                        if (grass <= 0 || y[jj*4+ii] < grass)
                            continue;
                        spawn.x = cx0 + ii * 4;
                        spawn.z = cz0 + jj * 4;
                        return spawn;
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }
    else
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 121; i++)
        {
            if (j >= -5 && j <= 5 && k >= -5 && k <= 5)
            {
                // find server spawn point in chunk
                cx0 = (spawn.x & ~15) + j * 16;
                cz0 = (spawn.z & ~15) + k * 16;
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        float y;
                        int id;
                        int x = cx0 + ii * 4;
                        int z = cz0 + jj * 4;
                        mapApproxHeight(&y, &id, g, &sn, x >> 2, z >> 2, 1, 1);
                        if (y > 63 || id == frozen_ocean ||
                            id == deep_frozen_ocean || id == frozen_river)
                        {
                            spawn.x = x;
                            spawn.z = z;
                            return spawn;
                        }
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }

    return spawn;
}